

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::VertexCubeTextureCase::iterate(VertexCubeTextureCase *this)

{
  ulong *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  GLuint program;
  int iVar4;
  TextureCube *pTVar5;
  RenderContext *context;
  CubeFace CVar6;
  undefined4 uVar7;
  bool bVar8;
  int i_1;
  deUint32 dVar9;
  GLuint GVar10;
  GLint GVar11;
  RenderTarget *pRVar12;
  long lVar13;
  unsigned_short uVar14;
  int iVar15;
  long lVar16;
  ConstPixelBufferAccess *pCVar17;
  char *description;
  bool bVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  iterator iVar23;
  void *data;
  CubeFace CVar24;
  unsigned_short uVar25;
  unsigned_short uVar26;
  int i;
  long lVar27;
  int x;
  int iVar28;
  RGBA *pRVar29;
  float *pfVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  Vector<float,_2> res;
  Surface resImage;
  float scaleFloat;
  Vec4 color;
  Vec3 texCoord;
  Vec2 quadVertices [4];
  Vector<float,_3> res_5;
  Vector<float,_3> res_3;
  Vector<float,_3> res_4;
  Vec3 coordAC;
  Vec3 coordAB;
  Surface refImage;
  Random rnd;
  int local_2e4;
  undefined1 local_2c8 [8];
  float local_2c0;
  pointer local_2b8;
  ConstPixelBufferAccess *local_2b0;
  int local_2a8;
  float local_2a4;
  float local_2a0;
  float local_29c;
  undefined1 local_298 [8];
  ArrayBuffer<unsigned_int,_4UL,_4UL> local_290;
  undefined1 local_280 [16];
  ArrayBuffer<unsigned_int,_4UL,_4UL> local_270;
  ArrayBuffer<unsigned_int,_4UL,_4UL> local_260;
  unsigned_short *local_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  uint local_22c;
  uint local_228;
  CubeFace local_224;
  undefined1 local_220 [12];
  float fStack_214;
  value_type local_210;
  ConstPixelBufferAccess *local_200;
  RGBA local_1f8 [2];
  float local_1f0;
  float local_1e8;
  ChannelType local_1d0;
  ChannelType local_1cc;
  int local_1c8;
  int local_1c4;
  float local_1c0;
  float local_1bc;
  undefined1 local_1b8 [12];
  ChannelType CStack_1ac;
  undefined8 local_1a8;
  float local_1a0;
  float local_19c;
  float local_178 [4];
  float local_168 [4];
  float local_158 [4];
  float local_148 [4];
  float local_138 [4];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [36];
  int local_f4;
  ChannelType local_f0;
  int local_ec;
  ChannelType local_e8;
  undefined4 local_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ChannelOrder local_d0;
  int local_cc;
  int local_c8;
  ChannelType local_c4;
  undefined4 local_c0;
  undefined8 local_bc;
  undefined8 uStack_b4;
  int local_ac;
  int local_a8;
  int local_a4;
  ChannelType local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  long local_60;
  Surface local_58;
  deRandom local_40;
  
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar32 = 0xa8;
  if (pRVar12->m_width < 0xa8) {
    iVar32 = pRVar12->m_width;
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_70 = 0x70;
  if (pRVar12->m_height < 0x70) {
    local_70 = (ulong)(uint)pRVar12->m_height;
  }
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar22 = pRVar12->m_width;
  pRVar12 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar15 = pRVar12->m_height;
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar9);
  dVar9 = deRandom_getUint32(&local_40);
  local_228 = dVar9 % ((iVar22 - iVar32) + 1U);
  dVar9 = deRandom_getUint32(&local_40);
  iVar21 = (int)local_70;
  local_22c = dVar9 % ((iVar15 - iVar21) + 1U);
  glwUseProgram((this->m_program->m_program).m_program);
  uVar19 = (int)(local_70 >> 0x1f) + iVar21 >> 1;
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  tcu::Surface::Surface(&local_58,iVar32,iVar21);
  iVar22 = iVar21 + 3;
  if (-1 < iVar21) {
    iVar22 = iVar21;
  }
  local_1cc = iVar22 >> 2;
  local_1d0 = uVar19 - local_1cc;
  CVar24 = CUBEFACE_NEGATIVE_X;
  local_78 = (ulong)(uint)(iVar32 / 2);
  local_80 = (ulong)uVar19;
  local_88 = (ulong)(uint)(iVar32 / 6);
  local_1c8 = iVar32;
  do {
    local_118._4_4_ = SNORM_INT8;
    if (CUBEFACE_NEGATIVE_Y < CVar24) {
      local_118._4_4_ = local_1cc;
    }
    local_cc = local_118._4_4_ + (int)local_80;
    local_c4 = local_1cc;
    CVar6 = CVar24;
    local_118._12_4_ = local_1cc;
    if (CUBEFACE_NEGATIVE_Y < CVar24) {
      local_c4 = (int)local_70 - local_cc;
      CVar6 = CVar24 - CUBEFACE_POSITIVE_Y;
      local_118._12_4_ = local_1d0;
    }
    iVar32 = (int)local_88;
    local_118._0_4_ = CVar6 * iVar32;
    local_f4 = local_118._0_4_ + (int)local_78;
    local_118._8_4_ = (int)local_78 - local_118._0_4_;
    if (CVar24 != CUBEFACE_POSITIVE_Z && CVar24 != CUBEFACE_NEGATIVE_Y) {
      local_118._8_4_ = iVar32;
    }
    local_118._16_4_ = 0;
    local_118._20_4_ = 0x3f800000;
    local_118._24_4_ = 0x3f800000;
    local_118._28_8_ = 0;
    local_f0 = local_118._4_4_;
    local_ec = local_1c8 - local_f4;
    if (CVar24 != CUBEFACE_POSITIVE_Z && CVar24 != CUBEFACE_NEGATIVE_Y) {
      local_ec = iVar32;
    }
    local_e8 = local_118._12_4_;
    local_e4 = 0;
    local_e0 = 0x3e99999a3e99999a;
    uStack_d8 = 0x3e99999a3f000000;
    local_d0 = local_118._0_4_;
    local_c8 = local_118._8_4_;
    local_c0 = 1;
    local_bc = 0x3f8000003f800000;
    uStack_b4 = 0;
    local_ac = local_f4;
    local_a8 = local_cc;
    local_a4 = local_ec;
    local_a0 = local_c4;
    local_9c = 1;
    local_98 = 0x3e99999a3e99999a;
    uStack_90 = 0x3e99999a3f000000;
    lVar27 = 0;
    local_224 = CVar24;
    do {
      local_68 = lVar27;
      fVar38 = (float)(this->m_textures[*(int *)(local_118 + lVar27 * 0x24 + 0x10)]->m_refTexture).
                      m_size;
      auVar41._0_4_ = (float)(int)*(undefined8 *)(local_118 + lVar27 * 0x24 + 8);
      auVar41._4_4_ = (float)(int)((ulong)*(undefined8 *)(local_118 + lVar27 * 0x24 + 8) >> 0x20);
      auVar41._8_8_ = 0;
      auVar40._0_4_ = fVar38 * (float)*(undefined8 *)(local_118 + lVar27 * 0x24 + 0x14);
      auVar40._4_4_ =
           fVar38 * (float)((ulong)*(undefined8 *)(local_118 + lVar27 * 0x24 + 0x14) >> 0x20);
      auVar40._8_4_ = fVar38 * 0.0;
      auVar40._12_4_ = fVar38 * 0.0;
      auVar41 = divps(auVar40,auVar41);
      uVar19 = -(uint)(auVar41._4_4_ <= auVar41._0_4_);
      fVar34 = logf((float)(~uVar19 & (uint)auVar41._4_4_ | (uint)auVar41._0_4_ & uVar19));
      fVar34 = fVar34 * 1.442695;
      local_128 = *(float *)((long)this->m_textures + (ulong)(fVar34 <= 0.0) * 4 + -0x18);
      iVar32 = *(int *)(local_118 + lVar27 * 0x24 + 8);
      iVar22 = *(int *)(local_118 + lVar27 * 0x24 + 0xc);
      local_1c4 = (this->m_textures[*(int *)(local_118 + lVar27 * 0x24 + 0x10)]->m_refTexture).
                  m_size;
      fVar38 = *(float *)(local_118 + lVar27 * 0x24 + 0x14);
      local_1bc = *(float *)(local_118 + lVar27 * 0x24 + 0x18);
      local_200 = (ConstPixelBufferAccess *)
                  CONCAT44(local_200._4_4_,*(undefined4 *)(local_118 + lVar27 * 0x24 + 0x1c));
      local_60 = lVar27 * 9;
      local_1c0 = *(float *)(local_118 + lVar27 * 0x24 + 0x20);
      local_298._0_4_ = 0x3f;
      local_290 = (ArrayBuffer<unsigned_int,_4UL,_4UL>)ZEXT416(0);
      local_250 = (unsigned_short *)0x0;
      local_280 = (undefined1  [16])local_290;
      local_270 = local_290;
      local_260 = local_290;
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                 (local_298 + 8),0x3e04);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_260,
                 (long)(local_298._0_4_ * local_298._0_4_ * 6));
      uVar19 = local_298._0_4_;
      if (0 < (int)local_298._0_4_) {
        iVar15 = 0;
        do {
          if ((int)uVar19 < 1) {
            iVar15 = iVar15 + 1;
          }
          else {
            local_2a8 = iVar15 + 1;
            local_2b0 = (ConstPixelBufferAccess *)CONCAT44(local_2b0._4_4_,(float)iVar15 / 63.0);
            local_2a4 = (float)local_2a8 / 63.0;
            iVar21 = 0;
            do {
              fVar35 = (float)iVar21;
              iVar21 = iVar21 + 1;
              local_1b8._4_4_ = (ChannelType)local_2b0;
              local_1b8._0_4_ = fVar35 / 63.0;
              stack0xfffffffffffffe50 =
                   (pointer)CONCAT44((ChannelType)local_2b0,(float)iVar21 / 63.0);
              local_1a8 = (pointer)CONCAT44(local_2a4,fVar35 / 63.0);
              local_1a0 = (float)iVar21 / 63.0;
              local_19c = local_2a4;
              uVar19 = (int)local_290.m_cap - (int)local_290.m_ptr;
              lVar27 = 0;
              do {
                local_220._0_8_ = local_220._0_8_ & 0xffffffff00000000;
                local_1f8 = (RGBA  [2])((ulong)local_1f8 & 0xffffffff00000000);
                lVar13 = 0;
                pRVar29 = (RGBA *)local_220;
                iVar15 = iVar32;
                bVar8 = true;
                do {
                  bVar18 = bVar8;
                  local_248 = (float)iVar15;
                  local_1e8 = *(float *)(local_1b8 + lVar13 * 4 + lVar27 * 8) * local_248 + 0.5;
                  fVar35 = floorf(local_1e8);
                  pRVar29->m_value =
                       (deUint32)(((local_1e8 - fVar35) * 0.5 + fVar35 + 0.25 + -0.5) / local_248);
                  lVar13 = 1;
                  pRVar29 = local_1f8;
                  iVar15 = iVar22;
                  bVar8 = false;
                } while (bVar18);
                local_2c8._4_4_ = (float)local_1f8[0].m_value + (float)local_1f8[0].m_value + -1.0;
                local_2c8._0_4_ = (float)local_220._0_4_ + (float)local_220._0_4_ + -1.0;
                std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
                emplace_back<tcu::Vector<float,2>>
                          ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                           (local_298 + 8),(Vector<float,_2> *)local_2c8);
                lVar27 = lVar27 + 1;
              } while (lVar27 != 4);
              uVar25 = (unsigned_short)(uVar19 >> 3);
              if ((unsigned_short *)local_260.m_cap == local_250) {
                local_2c8._0_2_ = uVar25;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_260,
                           (iterator)local_260.m_cap,(unsigned_short *)local_2c8);
                iVar23._M_current = (unsigned_short *)local_260.m_cap;
              }
              else {
                *(unsigned_short *)local_260.m_cap = uVar25;
                iVar23._M_current = (unsigned_short *)(local_260.m_cap + 2);
                local_260.m_cap = (size_t)iVar23._M_current;
              }
              uVar26 = uVar25 + 1;
              if (iVar23._M_current == local_250) {
                local_2c8._0_2_ = uVar26;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_260,
                           iVar23,(unsigned_short *)local_2c8);
                iVar23._M_current = (unsigned_short *)local_260.m_cap;
              }
              else {
                *iVar23._M_current = uVar26;
                local_260.m_cap = (size_t)(iVar23._M_current + 1);
                iVar23._M_current = iVar23._M_current + 1;
              }
              uVar14 = uVar25 + 2;
              if (iVar23._M_current == local_250) {
                local_2c8._0_2_ = uVar14;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_260,
                           iVar23,(unsigned_short *)local_2c8);
                iVar23._M_current = (unsigned_short *)local_260.m_cap;
              }
              else {
                *iVar23._M_current = uVar14;
                local_260.m_cap = (size_t)(iVar23._M_current + 1);
                iVar23._M_current = iVar23._M_current + 1;
              }
              if (iVar23._M_current == local_250) {
                local_2c8._0_2_ = uVar26;
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_260,
                           iVar23,(unsigned_short *)local_2c8);
                iVar23._M_current = (unsigned_short *)local_260.m_cap;
              }
              else {
                *iVar23._M_current = uVar26;
                local_260.m_cap = (size_t)(iVar23._M_current + 1);
                iVar23._M_current = iVar23._M_current + 1;
              }
              local_2c8._0_2_ = uVar25 + 3;
              if (iVar23._M_current == local_250) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_260,
                           iVar23,(unsigned_short *)local_2c8);
                iVar23._M_current = (unsigned_short *)local_260.m_cap;
              }
              else {
                *iVar23._M_current = local_2c8._0_2_;
                local_260.m_cap = (size_t)(iVar23._M_current + 1);
                iVar23._M_current = iVar23._M_current + 1;
              }
              local_2c8._0_2_ = uVar14;
              if (iVar23._M_current == local_250) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_260,
                           iVar23,(unsigned_short *)local_2c8);
              }
              else {
                *iVar23._M_current = uVar14;
                local_260.m_cap = (size_t)(iVar23._M_current + 1);
              }
              uVar19 = local_298._0_4_;
              iVar15 = local_2a8;
            } while (iVar21 < (int)local_298._0_4_);
          }
        } while (iVar15 < (int)uVar19);
      }
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::reserve
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                 (local_280 + 8),(long)(int)(uVar19 * uVar19 * 4));
      fVar35 = (float)(int)local_298._0_4_;
      local_1b8._0_4_ = R;
      local_1b8._4_4_ = SNORM_INT8;
      stack0xfffffffffffffe50 = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      glu::TextureTestUtil::computeQuadTexCoordCube
                ((vector<float,_std::allocator<float>_> *)local_1b8,local_224);
      lVar27 = local_60 * 4;
      local_2c8 = (undefined1  [8])*(float (*) [2])local_1b8._0_8_;
      local_2c0 = (*(float (*) [2])(local_1b8._0_8_ + 8))[0];
      local_220._0_8_ = *(ulong *)(local_1b8._0_8_ + 0xc);
      local_220._8_4_ = *(float *)(local_1b8._0_8_ + 0x14);
      local_1f8 = (RGBA  [2])*(float (*) [2])(local_1b8._0_8_ + 0x18);
      local_1f0 = (*(float (*) [2])(local_1b8._0_8_ + 0x20))[0];
      local_138[2] = 0.0;
      local_138[0] = 0.0;
      local_138[1] = 0.0;
      lVar13 = 0;
      do {
        local_138[lVar13] = *(float *)(local_220 + lVar13 * 4) - *(float *)(local_2c8 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_148[2] = 0.0;
      local_148[0] = 0.0;
      local_148[1] = 0.0;
      lVar13 = 0;
      do {
        local_148[lVar13] = (float)local_1f8[lVar13].m_value - *(float *)(local_2c8 + lVar13 * 4);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      if (0 < (int)local_298._0_4_) {
        local_248 = (float)local_1c4;
        local_2b0 = (ConstPixelBufferAccess *)((ulong)local_2b0 & 0xffffffff00000000);
        fVar37 = local_128;
        uVar19 = local_298._0_4_;
        do {
          if (0 < (int)uVar19) {
            fVar36 = ((float)(int)(ChannelType)local_2b0 / fVar35) * local_1bc + local_1c0;
            iVar32 = 0;
            do {
              fVar39 = ((float)iVar32 / fVar35) * fVar38 + local_200._0_4_;
              if (((fVar37 == 1.36318e-41) || (fVar37 == 1.39934e-41)) ||
                 (local_2a0 = fVar36, local_29c = fVar39, fVar37 == 1.39906e-41)) {
                local_29c = 0.0;
                local_2a0 = 0.0;
                pfVar30 = &local_29c;
                bVar8 = true;
                do {
                  bVar18 = bVar8;
                  local_1e8 = fVar39 * local_248 + 0.5 + -0.5;
                  fVar37 = floorf(local_1e8);
                  *pfVar30 = ((local_1e8 - fVar37) * 0.5 + fVar37 + 0.25 + -0.5 + 0.5) / local_248;
                  pfVar30 = &local_2a0;
                  fVar37 = local_128;
                  bVar8 = false;
                  fVar39 = fVar36;
                } while (bVar18);
              }
              local_168[2] = 0.0;
              local_168[0] = 0.0;
              local_168[1] = 0.0;
              lVar13 = 0;
              do {
                local_168[lVar13] = local_148[lVar13] * local_29c;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_158[2] = 0.0;
              local_158[0] = 0.0;
              local_158[1] = 0.0;
              lVar13 = 0;
              do {
                local_158[lVar13] = *(float *)(local_2c8 + lVar13 * 4) + local_168[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_178[0] = 0.0;
              local_178[1] = 0.0;
              local_178[2] = 0.0;
              lVar13 = 0;
              do {
                local_178[lVar13] = local_138[lVar13] * local_2a0;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              local_210.m_data[2] = 0.0;
              local_210.m_data._0_8_ = (ConstPixelBufferAccess *)0x0;
              lVar13 = 0;
              do {
                local_210.m_data[lVar13] = local_158[lVar13] + local_178[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 3);
              iVar22 = 4;
              do {
                std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
                push_back((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                          (local_280 + 8),&local_210);
                iVar22 = iVar22 + -1;
              } while (iVar22 != 0);
              iVar32 = iVar32 + 1;
              uVar19 = local_298._0_4_;
            } while (iVar32 < (int)local_298._0_4_);
          }
          iVar32 = (ChannelType)local_2b0 + 1;
          local_2b0 = (ConstPixelBufferAccess *)CONCAT44(local_2b0._4_4_,iVar32);
        } while (iVar32 < (int)uVar19);
      }
      if ((TextureFormat)local_1b8._0_8_ != (TextureFormat)0x0) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
      }
      glwViewport(*(int *)(local_118 + lVar27) + local_228,
                  *(int *)(local_118 + lVar27 + 4) + local_22c,*(GLsizei *)(local_118 + lVar27 + 8),
                  *(GLsizei *)(local_118 + lVar27 + 0xc));
      iVar32 = *(int *)(local_118 + lVar27 + 0x10);
      program = (this->m_program->m_program).m_program;
      GVar10 = glwGetAttribLocation(program,"a_position");
      if (GVar10 != 0xffffffff) {
        glwEnableVertexAttribArray(GVar10);
        glwVertexAttribPointer(GVar10,2,0x1406,'\0',0,local_290.m_ptr);
      }
      GVar10 = glwGetAttribLocation(program,"a_texCoord");
      if (GVar10 != 0xffffffff) {
        glwEnableVertexAttribArray(GVar10);
        glwVertexAttribPointer(GVar10,3,0x1406,'\0',0,(void *)local_280._8_8_);
      }
      GVar11 = glwGetUniformLocation(program,"u_lod");
      if (GVar11 != -1) {
        glwUniform1f(GVar11,fVar34);
      }
      glwActiveTexture(0x84c0);
      glwBindTexture(0x8513,this->m_textures[iVar32]->m_glTexture);
      glwTexParameteri(0x8513,0x2802,this->m_wrapS);
      glwTexParameteri(0x8513,0x2803,this->m_wrapT);
      glwTexParameteri(0x8513,0x2801,this->m_minFilter);
      glwTexParameteri(0x8513,0x2800,this->m_magFilter);
      GVar11 = glwGetUniformLocation(program,"u_texture");
      if (GVar11 != -1) {
        glwUniform1i(GVar11,0);
      }
      glwDrawElements(4,local_298._0_4_ * local_298._0_4_ * 6,0x1403,local_260.m_ptr);
      iVar32 = *(int *)(local_118 + lVar27 + 0x10);
      glu::mapGLSampler((Sampler *)local_1b8,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                        this->m_magFilter);
      uVar7 = local_298._0_4_;
      pTVar5 = this->m_textures[iVar32];
      uVar20 = (ulong)(uint)local_298._0_4_;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2c8
                 ,(long)(int)(local_298._0_4_ * local_298._0_4_),(allocator_type *)local_220);
      if (0 < (int)uVar7) {
        lVar13 = 0;
        uVar19 = 0;
        do {
          uVar31 = 0;
          do {
            lVar16 = (long)(int)((local_298._0_4_ * uVar19 + (int)uVar31) * 4);
            tcu::TextureCubeView::sample
                      ((TextureCubeView *)local_220,(Sampler *)&(pTVar5->m_refTexture).m_view,
                       *(float *)(local_280._8_8_ + lVar16 * 0xc),
                       *(float *)(local_280._8_8_ + lVar16 * 0xc + 4),
                       *(float *)(local_280._8_8_ + lVar16 * 0xc + 8),fVar34);
            puVar1 = (ulong *)((long)local_2c8 + (long)((int)uVar31 + (int)lVar13) * 0x10);
            *puVar1 = local_220._0_8_;
            puVar1[1] = CONCAT44(fStack_214,local_220._8_4_);
            uVar31 = uVar31 + 1;
          } while (uVar20 != uVar31);
          uVar19 = uVar19 + 1;
          lVar13 = lVar13 + uVar20;
        } while (uVar19 != uVar7);
      }
      local_200 = (ConstPixelBufferAccess *)(long)(int)local_298._0_4_;
      if (0 < (long)local_200) {
        iVar32 = *(int *)(local_118 + lVar27 + 8);
        local_128 = (float)*(int *)(local_118 + lVar27 + 0xc);
        iVar22 = 0;
        local_2e4 = 0;
        fStack_124 = local_128;
        fStack_120 = local_128;
        fStack_11c = local_128;
        do {
          pCVar17 = (ConstPixelBufferAccess *)0x0;
          local_2a8 = iVar22;
          do {
            lVar13 = 0;
            do {
              *(undefined4 *)(local_220 + lVar13 * 4) =
                   *(undefined4 *)((long)((long)iVar22 * 0x10 + (long)local_2c8) + lVar13 * 4);
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            iVar15 = local_298._0_4_ * local_2e4 + (int)pCVar17;
            uVar2 = *(undefined8 *)((long)local_290.m_ptr + (long)(iVar15 * 4) * 8);
            uVar3 = *(undefined8 *)((long)local_290.m_ptr + (long)(iVar15 * 4 + 3) * 8);
            local_248 = (float)uVar2 * 0.5 + 0.5;
            fStack_244 = (float)((ulong)uVar2 >> 0x20) * 0.5 + 0.5;
            fStack_240 = (float)uVar3 * 0.5 + 0.5;
            fStack_23c = (float)((ulong)uVar3 >> 0x20) * 0.5 + 0.5;
            local_2b0 = pCVar17;
            fVar34 = ceilf(local_248 * (float)iVar32 + -0.5);
            local_2a4 = ceilf(fStack_240 * (float)iVar32 + -0.5);
            local_248 = fStack_244 * local_128 + -0.5;
            fStack_244 = fStack_23c * fStack_124 + -0.5;
            fStack_240 = fStack_240 * fStack_120 + 0.0;
            fStack_23c = fStack_23c * fStack_11c + 0.0;
            local_1e8 = ceilf(local_248);
            fVar35 = ceilf(fStack_244);
            fVar38 = (float)(int)local_1e8;
            local_248 = (float)(int)fVar35;
            if ((int)fVar38 < (int)local_248) {
              iVar21 = (int)fVar34;
              local_1e8 = (float)(int)local_2a4;
              iVar15 = (int)local_1e8 - iVar21;
              do {
                if (iVar21 < (int)local_1e8) {
                  iVar4 = *(int *)(local_118 + lVar27 + 4);
                  iVar28 = *(int *)(local_118 + lVar27) + iVar21;
                  iVar33 = iVar15;
                  do {
                    tcu::RGBA::RGBA(local_1f8,(Vec4 *)local_220);
                    *(deUint32 *)
                     ((long)local_58.m_pixels.m_ptr +
                     (long)(local_58.m_width * (iVar4 + (int)fVar38) + iVar28) * 4) =
                         local_1f8[0].m_value;
                    iVar28 = iVar28 + 1;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                fVar38 = (float)((int)fVar38 + 1);
              } while (fVar38 != local_248);
            }
            pCVar17 = (ConstPixelBufferAccess *)((long)&(local_2b0->m_format).order + 1);
            iVar22 = iVar22 + 1;
          } while (pCVar17 != local_200);
          local_2e4 = local_2e4 + 1;
          iVar22 = local_2a8 + (int)local_200;
        } while (local_2e4 != (int)local_200);
      }
      if ((float  [2])local_2c8 != (float  [2])0x0) {
        operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
      }
      if (local_260.m_ptr != (void *)0x0) {
        operator_delete(local_260.m_ptr,(long)local_250 - (long)local_260.m_ptr);
      }
      if ((void *)local_280._8_8_ != (void *)0x0) {
        operator_delete((void *)local_280._8_8_,local_270.m_cap - local_280._8_8_);
      }
      if (local_290.m_ptr != (void *)0x0) {
        operator_delete(local_290.m_ptr,local_280._0_8_ - (long)local_290.m_ptr);
      }
      lVar27 = local_68 + 1;
    } while (lVar27 != 4);
    CVar24 = local_224 + CUBEFACE_POSITIVE_X;
  } while (CVar24 != CUBEFACE_LAST);
  tcu::Surface::Surface((Surface *)local_298,local_1c8,(int)local_70);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1b8._0_4_ = RGBA;
  local_1b8._4_4_ = UNORM_INT8;
  data = (void *)local_290.m_cap;
  if ((void *)local_290.m_cap != (void *)0x0) {
    data = local_290.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_118,(TextureFormat *)local_1b8,local_298._0_4_,
             local_298._4_4_,1,data);
  glu::readPixels(context,local_228,local_22c,(PixelBufferAccess *)local_118);
  glwUseProgram(0);
  bVar8 = compareImages(((this->super_TestCase).m_context)->m_renderCtx,
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        &local_58,(Surface *)local_298);
  description = "Image comparison failed";
  if (bVar8) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar8,description
            );
  tcu::Surface::~Surface((Surface *)local_298);
  tcu::Surface::~Surface(&local_58);
  return STOP;
}

Assistant:

VertexCubeTextureCase::IterateResult VertexCubeTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_CUBE_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_CUBE_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 areas.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(1.0f, 1.0f);
	const Vec2 texMinOffset		(0.0f, 0.0f);
	const Vec2 texMagScale		(0.3f, 0.3f);
	const Vec2 texMagOffset		(0.5f, 0.3f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	// Each of the four areas is divided into 6 cells.
	const int defCellWidth	= viewportWidth / 2 / 3;
	const int defCellHeight	= viewportHeight / 2 / 2;

	for (int i = 0; i < tcu::CUBEFACE_LAST; i++)
	{
		const int	cellOffsetX			= defCellWidth * (i % 3);
		const int	cellOffsetY			= defCellHeight * (i / 3);
		const bool	isRightmostCell		= i == 2 || i == 5;
		const bool	isTopCell			= i >= 3;
		const int	leftCellWidth		= isRightmostCell	? leftWidth		- cellOffsetX : defCellWidth;
		const int	rightCellWidth		= isRightmostCell	? rightWidth	- cellOffsetX : defCellWidth;
		const int	bottomCellHeight	= isTopCell			? bottomHeight	- cellOffsetY : defCellHeight;
		const int	topCellHeight		= isTopCell			? topHeight		- cellOffsetY : defCellHeight;

		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(cellOffsetX + 0,			cellOffsetY + 0,				leftCellWidth,	bottomCellHeight),	0, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + 0,				rightCellWidth,	bottomCellHeight),	0, texMagScale, texMagOffset),
			Render(Rect(cellOffsetX + 0,			cellOffsetY + bottomHeight,		leftCellWidth,	topCellHeight),		1, texMinScale, texMinOffset),
			Render(Rect(cellOffsetX + leftWidth,	cellOffsetY + bottomHeight,		rightCellWidth,	topCellHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_CUBE, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_CUBE>(rend.texCoordScale, rend.texCoordOffset, (tcu::CubeFace)i), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}